

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O2

int gdImageTrueColorToPaletteBody(gdImagePtr oim,int dither,int colorsWanted,gdImagePtr *cimP)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar uVar4;
  int iVar6;
  int iVar7;
  gdImagePtr pgVar8;
  gdImagePtr oim_00;
  uchar **ppuVar9;
  uchar *puVar10;
  void *pvVar11;
  gdImagePtr nim;
  int iVar12;
  int *piVar13;
  undefined4 *puVar14;
  boxptr boxp;
  gdImagePtr pgVar15;
  ulong uVar16;
  ushort uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  my_cquantize_ptr cquantize;
  my_cquantize_ptr cquantize_00;
  ulong uVar21;
  my_cquantize_ptr cquantize_01;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  uint *puVar28;
  gdImagePtr nim_00;
  long lVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  char cVar35;
  short sVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  short *psVar41;
  int iVar42;
  int iVar43;
  size_t size;
  long lVar44;
  bool bVar45;
  int local_dc;
  short sVar5;
  
  if (cimP == (gdImagePtr *)0x0) {
    pgVar8 = oim;
    if (oim->trueColor == 0) {
      return 1;
    }
LAB_0011d8fa:
    uVar37 = 0xff - (oim->transparent >> 0x1f);
    if (colorsWanted <= (int)uVar37) {
      uVar37 = colorsWanted;
    }
    if (cimP == (gdImagePtr *)0x0) {
      ppuVar9 = (uchar **)gdCalloc(8,(long)oim->sy);
      pgVar8->pixels = ppuVar9;
      if (ppuVar9 != (uchar **)0x0) {
        oim_00 = (gdImagePtr)0x0;
        lVar23 = 0;
        do {
          if (pgVar8->sy <= lVar23) {
            if (oim->paletteQuantizationMethod == 2) goto LAB_0011d943;
            goto LAB_0011da89;
          }
          puVar10 = (uchar *)gdCalloc(1,(long)oim->sx);
          pgVar8->pixels[lVar23] = puVar10;
          ppuVar9 = pgVar8->pixels + lVar23;
          lVar23 = lVar23 + 1;
        } while (*ppuVar9 != (uchar *)0x0);
        goto LAB_0011daeb;
      }
      if (oim->trueColor == 0) {
        return 0;
      }
      oim_00 = (gdImagePtr)0x0;
LAB_0011de96:
      pgVar8->pixels = (uchar **)0x0;
      iVar18 = 0;
    }
    else {
      if (oim->paletteQuantizationMethod == 2) {
        gdImageDestroy(pgVar8);
LAB_0011d943:
        iVar18 = 2;
        if (oim->paletteQuantizationSpeed != 0) {
          iVar18 = oim->paletteQuantizationSpeed;
        }
        pgVar8 = gdImageNeuQuant(oim,uVar37,iVar18);
        if (cimP != (gdImagePtr *)0x0) {
          *cimP = pgVar8;
        }
        if (pgVar8 != (gdImagePtr)0x0) {
          free_truecolor_image_data(oim);
          gdImageCopy(oim,pgVar8,0,0,0,0,oim->sx,oim->sy);
          gdImageDestroy(pgVar8);
          return 1;
        }
        goto LAB_0011d9a4;
      }
LAB_0011da89:
      oim_00 = (gdImagePtr)gdCalloc(0x28,1);
      if (oim_00 != (gdImagePtr)0x0) {
        oim_00->sx = 0;
        oim_00->sy = 0;
        oim_00->red[1] = 0;
        oim_00->red[2] = 0;
        ppuVar9 = (uchar **)gdMalloc(0x100);
        oim_00->pixels = ppuVar9;
        lVar23 = 0;
LAB_0011dabb:
        if (lVar23 != 0x20) goto code_r0x0011dac1;
        pvVar11 = gdMalloc(6);
        *(void **)&oim_00->sx = pvVar11;
        pvVar11 = gdMalloc(0x7fc);
        *(void **)(oim_00->red + 3) = pvVar11;
        if (pvVar11 != (void *)0x0) {
          lVar23 = (long)pvVar11 + 0x3fc;
          *(long *)(oim_00->red + 1) = lVar23;
          lVar20 = 0;
          for (lVar27 = 0; lVar27 != 0x10; lVar27 = lVar27 + 1) {
            *(int *)(lVar23 + lVar27 * 4) = (int)lVar27;
            *(int *)(lVar23 + lVar20 * 4) = (int)lVar20;
            lVar20 = lVar20 + -1;
          }
          piVar13 = (int *)((long)pvVar11 + 0x3bc);
          iVar18 = 0x10;
          for (lVar23 = 0; lVar23 != 0x20; lVar23 = lVar23 + 1) {
            *(int *)((long)pvVar11 + lVar23 * 4 + 0x43c) = iVar18;
            *piVar13 = -iVar18;
            iVar18 = iVar18 + ((int)lVar23 + 0x10U & 1);
            piVar13 = piVar13 + -1;
          }
          puVar14 = (undefined4 *)((long)pvVar11 + 0x33c);
          for (lVar23 = 0; lVar23 != 0xd0; lVar23 = lVar23 + 1) {
            *(undefined4 *)((long)pvVar11 + lVar23 * 4 + 0x4bc) = 0x20;
            *puVar14 = 0xffffffe0;
            puVar14 = puVar14 + -1;
          }
        }
        size = (long)pgVar8->sx * 6 + 0xc;
        pvVar11 = gdReallocEx(*(void **)&oim_00->sx,size);
        *(void **)&oim_00->sx = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0011daeb;
        uVar22 = 0;
        memset(pvVar11,0,size);
        oim_00->colorsTotal = 0;
        zeroHistogram((hist3d)oim_00->pixels);
        ppuVar9 = oim_00->pixels;
        uVar38 = oim->sx;
        boxp = (boxptr)(ulong)uVar38;
        uVar16 = (ulong)(uint)oim->sy;
        if (oim->sy < 1) {
          uVar16 = uVar22;
        }
        for (; uVar22 != uVar16; uVar22 = uVar22 + 1) {
          puVar28 = (uint *)oim->tpixels[uVar22];
          for (uVar30 = uVar38; 0 < (int)uVar30; uVar30 = uVar30 - 1) {
            uVar32 = *puVar28;
            if ((oim->transparent < 0) || (uVar32 != oim->transparent)) {
              lVar23 = (ulong)(uVar32 >> 4 & 0xfc0) +
                       *(long *)((long)ppuVar9 + (ulong)(uVar32 >> 0x10 & 0xf8));
              uVar21 = (ulong)(uVar32 >> 2 & 0x3e);
              sVar5 = *(short *)(uVar21 + lVar23);
              sVar36 = sVar5 + 1;
              if (sVar36 == 0) {
                sVar36 = sVar5;
              }
              *(short *)(uVar21 + lVar23) = sVar36;
            }
            puVar28 = puVar28 + 1;
          }
        }
        iVar18 = overflow2(uVar37,0x28);
        if (iVar18 == 0) {
          nim = (gdImagePtr)gdMalloc((long)(int)uVar37 * 0x28);
          if (nim != (gdImagePtr)0x0) {
            nim->pixels = (uchar **)0x1f00000000;
            nim->sx = 0;
            nim->sy = 0x3f;
            nim->colorsTotal = 0;
            nim->red[0] = 0x1f;
            update_box(oim_00,nim,cquantize,boxp);
            uVar38 = 1;
            if (1 < (int)uVar37) {
              uVar38 = uVar37;
            }
            for (uVar16 = 1; (long)uVar16 < (long)(int)uVar37; uVar16 = uVar16 + 1) {
              if ((int)uVar37 < (int)uVar16 * 2) {
                iVar18 = 0;
                nim_00 = (gdImagePtr)0x0;
                uVar22 = uVar16;
                pgVar15 = nim;
                while (bVar45 = uVar22 != 0, uVar22 = uVar22 - 1, bVar45) {
                  if (iVar18 < pgVar15->red[1]) {
                    nim_00 = pgVar15;
                    iVar18 = pgVar15->red[1];
                  }
                  pgVar15 = (gdImagePtr)(pgVar15->red + 5);
                }
              }
              else {
                lVar23 = 0;
                nim_00 = (gdImagePtr)0x0;
                uVar22 = uVar16;
                pgVar15 = nim;
                while (bVar45 = uVar22 != 0, uVar22 = uVar22 - 1, bVar45) {
                  if ((lVar23 < *(long *)(pgVar15->red + 3)) && (0 < pgVar15->red[1])) {
                    lVar23 = *(long *)(pgVar15->red + 3);
                    nim_00 = pgVar15;
                  }
                  pgVar15 = (gdImagePtr)(pgVar15->red + 5);
                }
              }
              if (nim_00 == (gdImagePtr)0x0) goto LAB_0011df20;
              iVar18 = *(int *)((long)&nim_00->pixels + 4);
              nim->red[uVar16 * 10 + -4] = iVar18;
              iVar40 = nim_00->sy;
              nim->red[uVar16 * 10 + -2] = iVar40;
              iVar6 = nim_00->red[0];
              nim->red[uVar16 * 10] = iVar6;
              iVar1 = *(int *)&nim_00->pixels;
              nim->red[uVar16 * 10 + -5] = iVar1;
              iVar31 = nim_00->sx;
              nim->red[uVar16 * 10 + -3] = iVar31;
              iVar2 = nim_00->colorsTotal;
              iVar25 = (iVar18 - iVar1) * 0x10;
              iVar42 = (iVar40 - iVar31) * 0xc;
              bVar45 = iVar25 + (iVar40 - iVar31) * -0xc < 0;
              iVar7 = iVar25;
              if (iVar25 == iVar42 || SBORROW4(iVar25,iVar42) != bVar45) {
                iVar7 = iVar42;
              }
              nim->red[uVar16 * 10 + -1] = iVar2;
              cVar35 = iVar25 == iVar42 || SBORROW4(iVar25,iVar42) != bVar45;
              if (iVar7 < (iVar6 - iVar2) * 8) {
                cVar35 = '\x02';
              }
              if (cVar35 == '\x02') {
                piVar13 = nim_00->red;
                pgVar15 = (gdImagePtr)(nim->red + uVar16 * 10 + -1);
                iVar31 = iVar2 + iVar6;
              }
              else if (cVar35 == '\x01') {
                piVar13 = &nim_00->sy;
                iVar31 = iVar31 + iVar40;
                pgVar15 = (gdImagePtr)(nim->red + uVar16 * 10 + -3);
              }
              else {
                piVar13 = (int *)((long)&nim_00->pixels + 4);
                iVar31 = iVar1 + iVar18;
                pgVar15 = (gdImagePtr)(nim->red + uVar16 * 10 + -5);
              }
              *piVar13 = iVar31 / 2;
              *(int *)&pgVar15->pixels = iVar31 / 2 + 1;
              update_box(oim_00,nim_00,(my_cquantize_ptr)(ulong)(uint)(iVar31 % 2),(boxptr)pgVar15);
              update_box(oim_00,(gdImagePtr)(nim->red + uVar16 * 10 + -5),cquantize_00,
                         (boxptr)pgVar15);
            }
            uVar16 = (ulong)uVar38;
LAB_0011df20:
            for (uVar22 = 0; uVar22 != (uVar16 & 0xffffffff); uVar22 = uVar22 + 1) {
              lVar34 = 0;
              lVar23 = 0;
              lVar29 = 0;
              lVar20 = 0;
              for (lVar27 = (long)nim->red[uVar22 * 10 + -5]; lVar27 <= nim->red[uVar22 * 10 + -4];
                  lVar27 = lVar27 + 1) {
                lVar24 = (long)nim->red[uVar22 * 10 + -3] << 6;
                for (lVar33 = (long)nim->red[uVar22 * 10 + -3]; lVar33 <= nim->red[uVar22 * 10 + -2]
                    ; lVar33 = lVar33 + 1) {
                  iVar18 = nim->red[uVar22 * 10 + -1] * 8 + 4;
                  for (lVar44 = (long)nim->red[uVar22 * 10 + -1]; lVar44 <= nim->red[uVar22 * 10];
                      lVar44 = lVar44 + 1) {
                    uVar21 = (ulong)*(ushort *)(oim_00->pixels[lVar27] + lVar44 * 2 + lVar24);
                    if (uVar21 != 0) {
                      lVar34 = lVar34 + uVar21;
                      lVar23 = lVar23 + uVar21 * (long)((int)lVar27 * 8 + 4);
                      lVar29 = lVar29 + uVar21 * (long)((int)lVar33 * 4 + 2);
                      lVar20 = lVar20 + (long)iVar18 * uVar21;
                    }
                    iVar18 = iVar18 + 8;
                  }
                  lVar24 = lVar24 + 0x40;
                }
              }
              if (lVar34 == 0) {
                iVar18 = 0xff;
                iVar40 = 0xff;
                iVar6 = 0xff;
              }
              else {
                lVar27 = lVar34 >> 1;
                iVar18 = (int)((lVar23 + lVar27) / lVar34);
                iVar40 = (int)((lVar29 + lVar27) / lVar34);
                iVar6 = (int)((lVar20 + lVar27) / lVar34);
              }
              pgVar8->red[uVar22] = iVar18;
              pgVar8->green[uVar22] = iVar40;
              pgVar8->blue[uVar22] = iVar6;
              pgVar8->open[uVar22] = 0;
            }
            pgVar8->colorsTotal = (int)uVar16;
            if (-1 < oim->transparent) {
              pgVar8->red[(int)uVar16] = (uint)oim->transparent >> 0x10 & 0xff;
              pgVar8->green[pgVar8->colorsTotal] = (uint)*(byte *)((long)&oim->transparent + 1);
              pgVar8->blue[pgVar8->colorsTotal] = (uint)(byte)oim->transparent;
              pgVar8->alpha[pgVar8->colorsTotal] = 0x7f;
              pgVar8->open[pgVar8->colorsTotal] = 0;
            }
            gdFree(nim);
          }
        }
        zeroHistogram((hist3d)oim_00->pixels);
        if (dither == 0) {
          iVar18 = oim->sx;
          ppuVar9 = oim_00->pixels;
          uVar22 = 0;
          uVar16 = (ulong)(uint)oim->sy;
          if (oim->sy < 1) {
            uVar16 = uVar22;
          }
          for (; uVar22 != uVar16; uVar22 = uVar22 + 1) {
            piVar13 = oim->tpixels[uVar22];
            puVar10 = pgVar8->pixels[uVar22];
            lVar23 = 0;
            for (iVar40 = iVar18; 0 < iVar40; iVar40 = iVar40 + -1) {
              uVar37 = piVar13[lVar23];
              if ((oim->transparent < 0) || (oim->transparent != uVar37)) {
                cquantize_01 = (my_cquantize_ptr)(ulong)(uVar37 >> 0x13 & 0x1f);
                uVar38 = uVar37 >> 10 & 0x3f;
                uVar30 = uVar37 >> 3 & 0x1f;
                uVar37 = uVar38 << 6;
                puVar3 = ppuVar9[(long)cquantize_01];
                sVar5 = *(short *)(puVar3 + (ulong)uVar30 * 2 + (ulong)uVar37);
                if (sVar5 == 0) {
                  fill_inverse_cmap(pgVar8,oim_00,cquantize_01,uVar38,uVar30,(int)oim);
                  sVar5 = *(short *)(puVar3 + (ulong)uVar30 * 2 + (ulong)uVar37);
                }
                uVar4 = (char)sVar5 + 0xff;
              }
              else {
                uVar4 = (uchar)pgVar8->colorsTotal;
              }
              puVar10[lVar23] = uVar4;
              lVar23 = lVar23 + 1;
            }
          }
        }
        else {
          ppuVar9 = oim_00->pixels;
          lVar23 = *(long *)(oim_00->red + 1);
          iVar18 = oim->sx;
          uVar22 = 0;
          uVar16 = (ulong)(uint)oim->sy;
          if (oim->sy < 1) {
            uVar16 = uVar22;
          }
          for (; uVar22 != uVar16; uVar22 = uVar22 + 1) {
            piVar13 = oim->tpixels[uVar22];
            puVar10 = pgVar8->pixels[uVar22];
            if (oim_00->colorsTotal == 0) {
              psVar41 = *(short **)&oim_00->sx;
              lVar20 = 1;
              iVar40 = 3;
            }
            else {
              piVar13 = piVar13 + ((long)iVar18 + -1) * 3;
              puVar10 = puVar10 + (int)((long)iVar18 + -1);
              psVar41 = (short *)((long)(iVar18 * 3 + 3) * 2 + *(long *)&oim_00->sx);
              lVar20 = -1;
              iVar40 = -3;
            }
            lVar27 = 0;
            iVar7 = 0;
            iVar31 = 0;
            local_dc = 0;
            iVar2 = 0;
            iVar1 = 0;
            iVar6 = 0;
            iVar42 = 0;
            iVar12 = 0;
            iVar19 = 0;
            iVar25 = iVar18;
            while( true ) {
              if (iVar25 < 1) break;
              uVar37 = piVar13[lVar27];
              if ((oim->transparent < 0) || (uVar37 != oim->transparent)) {
                uVar38 = (uVar37 >> 0x10 & 0xff) +
                         *(int *)(lVar23 + (long)(iVar19 + psVar41[iVar40] + 8 >> 4) * 4);
                if ((int)uVar38 < 1) {
                  uVar38 = 0;
                }
                if (0xfe < (int)uVar38) {
                  uVar38 = 0xff;
                }
                uVar30 = (uVar37 >> 8 & 0xff) +
                         *(int *)(lVar23 + (long)(iVar12 + psVar41[iVar40 + 1] + 8 >> 4) * 4);
                if ((int)uVar30 < 1) {
                  uVar30 = 0;
                }
                if (0xfe < (int)uVar30) {
                  uVar30 = 0xff;
                }
                uVar37 = (uVar37 & 0xff) +
                         *(int *)(lVar23 + (long)(iVar42 + psVar41[iVar40 + 2] + 8 >> 4) * 4);
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                if (0xfe < (int)uVar37) {
                  uVar37 = 0xff;
                }
                uVar32 = uVar37 >> 3;
                lVar29 = (ulong)((uVar30 >> 2) << 6) +
                         *(long *)((long)ppuVar9 + (ulong)(uVar38 & 0xf8));
                uVar17 = *(ushort *)(lVar29 + (ulong)uVar32 * 2);
                if (uVar17 == 0) {
                  fill_inverse_cmap(pgVar8,oim_00,(my_cquantize_ptr)(ulong)(uVar38 >> 3),uVar30 >> 2
                                    ,uVar32,(int)oim);
                  uVar17 = *(ushort *)(lVar29 + (ulong)uVar32 * 2);
                }
                puVar10[lVar27] = (char)uVar17 + 0xff;
                iVar39 = uVar38 - pgVar8->red[(ulong)uVar17 - 1];
                iVar26 = uVar30 - pgVar8->green[(ulong)uVar17 - 1];
                iVar43 = uVar37 - pgVar8->blue[(ulong)uVar17 - 1];
                *psVar41 = (short)iVar39 * 3 + (short)local_dc;
                local_dc = iVar39 * 5 + iVar6;
                psVar41[1] = (short)iVar26 * 3 + (short)iVar31;
                iVar31 = iVar26 * 5 + iVar1;
                iVar19 = iVar39 * 7;
                psVar41[2] = (short)iVar43 * 3 + (short)iVar7;
                iVar12 = iVar26 * 7;
                iVar7 = iVar43 * 5 + iVar2;
                iVar42 = iVar43 * 7;
                iVar6 = iVar39;
                iVar1 = iVar26;
                iVar2 = iVar43;
              }
              else {
                puVar10[lVar27] = (uchar)pgVar8->colorsTotal;
                psVar41[0] = 0;
                psVar41[1] = 0;
                psVar41[2] = 0;
                psVar41[3] = 0;
              }
              psVar41 = psVar41 + iVar40;
              iVar25 = iVar25 + -1;
              lVar27 = lVar27 + lVar20;
            }
            *psVar41 = (short)local_dc;
            psVar41[1] = (short)iVar31;
            psVar41[2] = (short)iVar7;
          }
        }
        if (-1 < oim->transparent) {
          pgVar8->transparent = pgVar8->colorsTotal;
          pgVar8->colorsTotal = pgVar8->colorsTotal + 1;
        }
        iVar18 = 1;
        if (cimP == (gdImagePtr *)0x0) {
          free_truecolor_image_data(oim);
        }
        goto LAB_0011de9c;
      }
      oim_00 = (gdImagePtr)0x0;
LAB_0011daeb:
      iVar18 = 0;
      if (oim->trueColor != 0) {
        if (cimP == (gdImagePtr *)0x0) {
          if (pgVar8->pixels != (uchar **)0x0) {
            for (lVar23 = 0; lVar23 < pgVar8->sy; lVar23 = lVar23 + 1) {
              puVar10 = pgVar8->pixels[lVar23];
              if (puVar10 != (uchar *)0x0) {
                gdFree(puVar10);
              }
            }
            gdFree(pgVar8->pixels);
          }
          goto LAB_0011de96;
        }
        gdImageDestroy(pgVar8);
        *cimP = (gdImagePtr)0x0;
      }
    }
LAB_0011de9c:
    if (oim_00 != (gdImagePtr)0x0) {
      if (oim_00->pixels != (uchar **)0x0) {
        for (lVar23 = 0; lVar23 != 0x20; lVar23 = lVar23 + 1) {
          puVar10 = oim_00->pixels[lVar23];
          if (puVar10 != (uchar *)0x0) {
            gdFree(puVar10);
          }
        }
        gdFree(oim_00->pixels);
      }
      if (*(void **)&oim_00->sx != (void *)0x0) {
        gdFree(*(void **)&oim_00->sx);
      }
      if (*(void **)(oim_00->red + 3) != (void *)0x0) {
        gdFree(*(void **)(oim_00->red + 3));
      }
      gdFree(oim_00);
    }
  }
  else {
    pgVar8 = gdImageCreate(oim->sx,oim->sy);
    *cimP = pgVar8;
    if (pgVar8 != (gdImagePtr)0x0) {
      if (oim->trueColor == 0) {
        gdImageCopy(pgVar8,oim,0,0,0,0,oim->sx,oim->sy);
        *cimP = pgVar8;
        return 1;
      }
      goto LAB_0011d8fa;
    }
LAB_0011d9a4:
    iVar18 = 0;
  }
  return iVar18;
code_r0x0011dac1:
  puVar10 = (uchar *)gdMalloc(0x1000);
  oim_00->pixels[lVar23] = puVar10;
  ppuVar9 = oim_00->pixels + lVar23;
  lVar23 = lVar23 + 1;
  if (*ppuVar9 == (uchar *)0x0) goto LAB_0011daeb;
  goto LAB_0011dabb;
}

Assistant:

static int gdImageTrueColorToPaletteBody (gdImagePtr oim, int dither, int colorsWanted, gdImagePtr *cimP)
{
	my_cquantize_ptr cquantize = NULL;
	int i, conversionSucceeded=0;

	/* Allocate the JPEG palette-storage */
	size_t arraysize;
	int maxColors = gdMaxColors;
	gdImagePtr nim;

	if (cimP) {
		nim = gdImageCreate(oim->sx, oim->sy);
		*cimP = nim;
		if (!nim) {
			return FALSE;
		}
	} else {
		nim = oim;
	}

	if (!oim->trueColor) {
		/* (Almost) nothing to do! */
		if (cimP) {
			gdImageCopy(nim, oim, 0, 0, 0, 0, oim->sx, oim->sy);
			*cimP = nim;
		}
		return TRUE;
	}

	/* If we have a transparent color (the alphaless mode of transparency), we
	 * must reserve a palette entry for it at the end of the palette. */
	if (oim->transparent >= 0) {
		maxColors--;
	}
	if (colorsWanted > maxColors) {
		colorsWanted = maxColors;
	}
	if (!cimP) {
		nim->pixels = gdCalloc (sizeof (unsigned char *), oim->sy);
		if (!nim->pixels) {
			/* No can do */
			goto outOfMemory;
		}
		for (i = 0; (i < nim->sy); i++) {
			nim->pixels[i] = (unsigned char *) gdCalloc (sizeof (unsigned char), oim->sx);
			if (!nim->pixels[i]) {
				goto outOfMemory;
			}
		}
	}


	if (oim->paletteQuantizationMethod == GD_QUANT_NEUQUANT) {
		if (cimP) { /* NeuQuant alwasy creates a copy, so the new blank image can't be used */
			gdImageDestroy(nim);
		}
		nim = gdImageNeuQuant(oim, colorsWanted, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 2);
		if (cimP) {
			*cimP = nim;
		} 
		if (!nim) {
			return FALSE;
		} else {
			free_truecolor_image_data(oim);
			gdImageCopy(oim, nim, 0, 0, 0, 0, oim->sx, oim->sy);
			gdImageDestroy(nim);
		}
		return TRUE;
	}


#ifdef HAVE_LIBIMAGEQUANT
	if (oim->paletteQuantizationMethod == GD_QUANT_DEFAULT ||
	        oim->paletteQuantizationMethod == GD_QUANT_LIQ) {
		liq_attr *attr = liq_attr_create_with_allocator(gdMalloc, gdFree);
		liq_image *image;
		liq_result *remap;
		int remapped_ok = 0;

		liq_set_max_colors(attr, colorsWanted);

		/* by default make it fast to match speed of previous implementation */
		liq_set_speed(attr, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 9);
		if (oim->paletteQuantizationMaxQuality) {
			liq_set_quality(attr, oim->paletteQuantizationMinQuality, oim->paletteQuantizationMaxQuality);
		}
		image = liq_image_create_custom(attr, convert_gdpixel_to_rgba, oim, oim->sx, oim->sy, 0);
		remap = liq_quantize_image(attr, image);
		if (!remap) { /* minimum quality not met, leave image unmodified */
			liq_image_destroy(image);
			liq_attr_destroy(attr);
			goto outOfMemory;
		}

		liq_set_dithering_level(remap, dither ? 1 : 0);
		if (LIQ_OK == liq_write_remapped_image_rows(remap, image, output_buf)) {
			remapped_ok = 1;
			const liq_palette *pal = liq_get_palette(remap);
			nim->transparent = -1;
			unsigned int icolor;
			for(icolor=0; icolor < pal->count; icolor++) {
				nim->open[icolor] = 0;
				nim->red[icolor] = pal->entries[icolor].r * gdRedMax/255;
				nim->green[icolor] = pal->entries[icolor].g * gdGreenMax/255;
				nim->blue[icolor] = pal->entries[icolor].b * gdBlueMax/255;
				int alpha = pal->entries[icolor].a * gdAlphaMax/255;
				if (gdAlphaOpaque < gdAlphaTransparent) {
					alpha = gdAlphaTransparent - alpha;
				}
				nim->alpha[icolor] = alpha;
				if (nim->transparent == -1 && alpha == gdAlphaTransparent) {
					nim->transparent = icolor;
				}
			}
			nim->colorsTotal = pal->count;
		}
		liq_result_destroy(remap);
		liq_image_destroy(image);
		liq_attr_destroy(attr);

		if (remapped_ok) {
			if (!cimP) {
				free_truecolor_image_data(oim);
			}
			return TRUE;
		}
	}
#endif

	cquantize = (my_cquantize_ptr) gdCalloc (sizeof (my_cquantizer), 1);
	if (!cquantize) {
		/* No can do */
		goto outOfMemory;
	}
	cquantize->fserrors = NULL;	/* flag optional arrays not allocated */
	cquantize->error_limiter = NULL;


	/* Allocate the histogram/inverse colormap storage */
	cquantize->histogram = (hist3d) gdMalloc (HIST_C0_ELEMS * sizeof (hist2d));
	for (i = 0; i < HIST_C0_ELEMS; i++) {
		cquantize->histogram[i] =
		    (hist2d) gdMalloc (HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof (histcell));
		if (!cquantize->histogram[i]) {
			goto outOfMemory;
		}
	}


	cquantize->fserrors = (FSERRPTR) gdMalloc (3 * sizeof (FSERROR));
	init_error_limit (oim, nim, cquantize);
	arraysize = (size_t) ((nim->sx + 2) * (3 * sizeof (FSERROR)));
	/* Allocate Floyd-Steinberg workspace. */
	cquantize->fserrors = gdReallocEx(cquantize->fserrors, arraysize);
	if (!cquantize->fserrors) {
		goto outOfMemory;
	}
	memset(cquantize->fserrors, 0, arraysize);
	cquantize->on_odd_row = FALSE;

	/* Do the work! */
	zeroHistogram (cquantize->histogram);
	prescan_quantize (oim, nim, cquantize);
	/* TBB 2.0.5: pass colorsWanted, not 256! */
	select_colors (oim, nim, cquantize, colorsWanted);
	zeroHistogram (cquantize->histogram);
	if (dither) {
		pass2_fs_dither (oim, nim, cquantize);
	} else {
		pass2_no_dither (oim, nim, cquantize);
	}
#if 0				/* 2.0.12; we no longer attempt full alpha in palettes */
	if (cquantize->transparentIsPresent) {
		int mt = -1;
		int mtIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] > mt) {
				mtIndex = i;
				mt = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mt) {
				im->alpha[i] = gdAlphaTransparent;
			}
		}
	}
	if (cquantize->opaqueIsPresent) {
		int mo = 128;
		int moIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] < mo) {
				moIndex = i;
				mo = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mo) {
				im->alpha[i] = gdAlphaOpaque;
			}
		}
	}
#endif

	/* If we had a 'transparent' color, increment the color count so it's
	 * officially in the palette and convert the transparent variable to point to
	 * an index rather than a color (Its data already exists and transparent
	 * pixels have already been mapped to it by this point, it is done late as to
	 * avoid color matching / dithering with it). */
	if (oim->transparent >= 0) {
		nim->transparent = nim->colorsTotal;
		nim->colorsTotal++;
	}

	/* Success! Get rid of the truecolor image data. */
	conversionSucceeded = TRUE;
	if (!cimP) {
		free_truecolor_image_data(oim);
	}

	goto freeQuantizeData;
	/* Tediously free stuff. */
outOfMemory:
	conversionSucceeded = FALSE;
	if (oim->trueColor) {
		if (!cimP) {
			/* On failure only */
			if (nim->pixels) {
				for (i = 0; i < nim->sy; i++) {
					if (nim->pixels[i]) {
						gdFree (nim->pixels[i]);
					}
				}
				gdFree (nim->pixels);
			}
			nim->pixels = NULL;
		} else {
			gdImageDestroy(nim);
			*cimP = 0;
		}
	}

freeQuantizeData:
	if (cquantize) {
		if (cquantize->histogram) {
			for (i = 0; i < HIST_C0_ELEMS; i++) {
				if (cquantize->histogram[i]) {
					gdFree (cquantize->histogram[i]);
				}
			}
			gdFree (cquantize->histogram);
		}
		if (cquantize->fserrors) {
			gdFree (cquantize->fserrors);
		}
		if (cquantize->error_limiter_storage) {
			gdFree (cquantize->error_limiter_storage);
		}
		gdFree (cquantize);
	}

	return conversionSucceeded;
}